

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

_Bool do_cmd_open_chest(loc grid,object *obj)

{
  uint32_t *puVar1;
  bitflag *pbVar2;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  uint32_t uVar6;
  ulong in_RAX;
  int iVar7;
  wchar_t wVar8;
  int iVar9;
  _Bool scatter;
  undefined8 uStack_38;
  
  bVar3 = true;
  uStack_38 = in_RAX;
  if (obj->pval < 1) {
    _Var4 = false;
    goto LAB_00188a27;
  }
  wVar8 = (player->state).skills[0];
  if (player->timed[2] == 0) {
    _Var4 = no_light(player);
    if (_Var4) goto LAB_00188972;
  }
  else {
LAB_00188972:
    wVar8 = wVar8 / 10;
  }
  if ((player->timed[4] != 0) || (player->timed[6] != 0)) {
    wVar8 = wVar8 / 10;
  }
  iVar9 = wVar8 - obj->pval;
  iVar7 = 2;
  if (2 < iVar9) {
    iVar7 = iVar9;
  }
  uVar6 = Rand_div(100);
  if ((int)uVar6 < iVar7) {
    _Var4 = false;
    msgt(0x57,"You have picked the lock.");
    player_exp_gain(player,1);
  }
  else {
    event_signal(EVENT_INPUT_FLUSH);
    bVar3 = false;
    msgt(0x1c,"You failed to pick the lock.");
    _Var4 = true;
  }
LAB_00188a27:
  if (bVar3) {
    uStack_38 = uStack_38 & 0xffffffffffffff;
    _Var5 = player_is_trapsafe(player);
    if (_Var5) {
      if (0 < obj->pval) {
        _Var5 = player_of_has(player,L'(');
        if (_Var5) {
          equip_learn_flag(player,L'(');
        }
      }
    }
    else {
      chest_trap(obj,(_Bool *)((long)&uStack_38 + 7));
    }
    chest_death(grid,obj,uStack_38._7_1_);
    puVar1 = &player->upkeep->notice;
    *puVar1 = *puVar1 | 2;
  }
  if (obj->pval == 0) {
    pbVar2 = &obj->known->notice;
    *pbVar2 = *pbVar2 | 4;
  }
  square_light_spot((chunk *)cave,grid);
  return _Var4;
}

Assistant:

bool do_cmd_open_chest(struct loc grid, struct object *obj)
{
	int i, j;

	bool flag = true;

	bool more = false;

	/* Attempt to unlock it */
	if (obj->pval > 0) {
		/* Assume locked, and thus not open */
		flag = false;

		/* Get the "disarm" factor */
		i = player->state.skills[SKILL_DISARM_PHYS];

		/* Penalize some conditions */
		if (player->timed[TMD_BLIND] || no_light(player)) i = i / 10;
		if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) i = i / 10;

		/* Extract the difficulty */
		j = i - obj->pval;

		/* Always have a small chance of success */
		if (j < 2) j = 2;

		/* Success -- May still have traps */
		if (randint0(100) < j) {
			msgt(MSG_LOCKPICK, "You have picked the lock.");
			player_exp_gain(player, 1);
			flag = true;
		} else {
			/* We may continue repeating */
			more = true;
			event_signal(EVENT_INPUT_FLUSH);
			msgt(MSG_LOCKPICK_FAIL, "You failed to pick the lock.");
		}
	}

	/* Allowed to open */
	if (flag) {
		bool scatter = false;

		/* Apply chest traps, if any and player is not trapsafe */
		if (!player_is_trapsafe(player)) {
			chest_trap(obj, &scatter);
		} else if ((obj->pval > 0) && player_of_has(player, OF_TRAP_IMMUNE)) {
			/* Learn trap immunity if there are traps */
			equip_learn_flag(player, OF_TRAP_IMMUNE);
		}

		/* Let the Chest drop items */
		chest_death(grid, obj, scatter);

		/* Ignore chest if autoignore calls for it */
		player->upkeep->notice |= PN_IGNORE;
	}

	/* Empty chests were always ignored in ignore_item_okay so we
	 * might as well ignore it here
	 */
	if (obj->pval == 0)
		obj->known->notice |= OBJ_NOTICE_IGNORE;

	/* Redraw chest, to be on the safe side (it may have been ignored) */
	square_light_spot(cave, grid);

	/* Result */
	return (more);
}